

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

MacroDef __thiscall slang::parsing::Preprocessor::findMacro(Preprocessor *this,Token directive)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  uint64_t uVar8;
  DefineDirectiveSyntax *pDVar9;
  char *pcVar10;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  MacroDef MVar14;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  Preprocessor *local_88;
  ulong local_80;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  string_view local_50;
  Token directive_local;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  local_50 = Token::valueText(&directive_local);
  local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_50,1,0xffffffffffffffff);
  if ((local_98._M_len != 0) && (*local_98._M_str == '\\')) {
    local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_98,1,0xffffffffffffffff);
  }
  uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                     &this->macros,&local_98);
  uVar11 = uVar8 >> ((byte)(this->macros).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                           .arrays.groups_size_index & 0x3f);
  lVar12 = (uVar8 & 0xff) * 4;
  local_78 = (&UNK_003fea9c)[lVar12];
  uStack_77 = (&UNK_003fea9d)[lVar12];
  uStack_76 = (&UNK_003fea9e)[lVar12];
  bStack_75 = (&UNK_003fea9f)[lVar12];
  local_80 = 0;
  local_88 = this;
  uStack_74 = local_78;
  uStack_73 = uStack_77;
  uStack_72 = uStack_76;
  bStack_71 = bStack_75;
  uStack_70 = local_78;
  uStack_6f = uStack_77;
  uStack_6e = uStack_76;
  bStack_6d = bStack_75;
  uStack_6c = local_78;
  uStack_6b = uStack_77;
  uStack_6a = uStack_76;
  bStack_69 = bStack_75;
  do {
    pgVar2 = (local_88->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar11;
    local_68 = pgVar1->m[0].n;
    uStack_67 = pgVar1->m[1].n;
    uStack_66 = pgVar1->m[2].n;
    bStack_65 = pgVar1->m[3].n;
    uStack_64 = pgVar1->m[4].n;
    uStack_63 = pgVar1->m[5].n;
    uStack_62 = pgVar1->m[6].n;
    bStack_61 = pgVar1->m[7].n;
    uStack_60 = pgVar1->m[8].n;
    uStack_5f = pgVar1->m[9].n;
    uStack_5e = pgVar1->m[10].n;
    bStack_5d = pgVar1->m[0xb].n;
    uStack_5c = pgVar1->m[0xc].n;
    uStack_5b = pgVar1->m[0xd].n;
    uStack_5a = pgVar1->m[0xe].n;
    bStack_59 = pgVar1->m[0xf].n;
    auVar13[0] = -(local_68 == local_78);
    auVar13[1] = -(uStack_67 == uStack_77);
    auVar13[2] = -(uStack_66 == uStack_76);
    auVar13[3] = -(bStack_65 == bStack_75);
    auVar13[4] = -(uStack_64 == uStack_74);
    auVar13[5] = -(uStack_63 == uStack_73);
    auVar13[6] = -(uStack_62 == uStack_72);
    auVar13[7] = -(bStack_61 == bStack_71);
    auVar13[8] = -(uStack_60 == uStack_70);
    auVar13[9] = -(uStack_5f == uStack_6f);
    auVar13[10] = -(uStack_5e == uStack_6e);
    auVar13[0xb] = -(bStack_5d == bStack_6d);
    auVar13[0xc] = -(uStack_5c == uStack_6c);
    auVar13[0xd] = -(uStack_5b == uStack_6b);
    auVar13[0xe] = -(uStack_5a == uStack_6a);
    auVar13[0xf] = -(bStack_59 == bStack_69);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0) {
      ppVar3 = (local_88->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.elements_;
      do {
        iVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((long)&ppVar3[uVar11 * 0xf].first._M_len + (ulong)(uint)(iVar5 << 5));
        bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &this->macros,&local_98,__y);
        if (bVar6) {
          pDVar9 = (DefineDirectiveSyntax *)__y[1]._M_len;
          pcVar10 = __y[1]._M_str;
          goto LAB_00184f56;
        }
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
      bStack_59 = pgVar2[uVar11].m[0xf].n;
    }
    pcVar10 = (char *)0x0;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bStack_59) == 0) break;
    uVar4 = (local_88->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .arrays.groups_size_mask;
    lVar12 = uVar11 + local_80;
    local_80 = local_80 + 1;
    uVar11 = lVar12 + 1U & uVar4;
  } while (local_80 <= uVar4);
  pDVar9 = (DefineDirectiveSyntax *)0x0;
LAB_00184f56:
  MVar14._8_8_ = pcVar10;
  MVar14.syntax = pDVar9;
  return MVar14;
}

Assistant:

Preprocessor::MacroDef Preprocessor::findMacro(Token directive) {
    std::string_view name = directive.valueText().substr(1);
    if (!name.empty() && name[0] == '\\')
        name = name.substr(1);

    auto it = macros.find(name);
    if (it == macros.end())
        return nullptr;
    return it->second;
}